

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

string * __thiscall
TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactPathTag>::Evaluate
          (string *__return_storage_ptr__,
          TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactPathTag> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  size_type *psVar6;
  _Alloc_hider _Var7;
  GeneratorExpressionContent *content_00;
  bool bVar8;
  string result;
  cmTarget *target;
  string name;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  cmTarget *local_58;
  string local_50;
  
  pbVar1 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (pbVar1->_M_dataplus)._M_p;
  content_00 = content;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + pbVar1->_M_string_length);
  bVar3 = cmGeneratorExpression::IsValidTargetName(&local_50);
  if (bVar3) {
    local_58 = cmMakefile::FindTargetToUse(context->Makefile,&local_50,false);
    if (local_58 == (cmTarget *)0x0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_98,content);
      std::operator+(&local_78,"No target \"",&local_50);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_b8.field_2._M_allocated_capacity = *psVar6;
        local_b8.field_2._8_8_ = plVar5[3];
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar6;
        local_b8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_b8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      reportError(context,&local_98,&local_b8);
LAB_00450b33:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      _Var7._M_p = local_78._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) goto LAB_00450b5c;
      goto LAB_00450b64;
    }
    if (local_58->TargetTypeValue != UNKNOWN_LIBRARY && 3 < (int)local_58->TargetTypeValue) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_98,content);
      std::operator+(&local_78,"Target \"",&local_50);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_b8.field_2._M_allocated_capacity = *psVar6;
        local_b8.field_2._8_8_ = plVar5[3];
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar6;
        local_b8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_b8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      reportError(context,&local_98,&local_b8);
      goto LAB_00450b33;
    }
    if (dagChecker == (cmGeneratorExpressionDAGChecker *)0x0) {
LAB_00450c0a:
      bVar3 = false;
LAB_00450c0d:
      bVar8 = false;
    }
    else {
      bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                        (dagChecker,local_50._M_dataplus._M_p);
      if (!bVar3) {
        bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagChecker);
        if (!bVar3) goto LAB_00450c0a;
        cmGeneratorExpressionDAGChecker::TopTarget_abi_cxx11_(&local_98,dagChecker);
        if (local_50._M_string_length == local_98._M_string_length) {
          bVar3 = true;
          if (local_50._M_string_length == 0) {
            bVar8 = true;
          }
          else {
            iVar4 = bcmp(local_50._M_dataplus._M_p,local_98._M_dataplus._M_p,
                         local_50._M_string_length);
            bVar8 = iVar4 == 0;
          }
          goto LAB_00450c10;
        }
        bVar3 = true;
        goto LAB_00450c0d;
      }
      bVar8 = true;
      bVar3 = false;
    }
LAB_00450c10:
    if ((bVar3) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2)) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (!bVar8) {
      std::
      _Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
      ::_M_insert_unique<cmTarget*const&>
                ((_Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
                  *)&context->DependTargets,&local_58);
      std::
      _Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
      ::_M_insert_unique<cmTarget_const*const&>
                ((_Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
                  *)&context->AllTargets,&local_58);
      TargetFilesystemArtifactResultCreator<ArtifactSonameTag>::Create_abi_cxx11_
                (&local_b8,(TargetFilesystemArtifactResultCreator<ArtifactSonameTag> *)local_58,
                 (cmTarget *)context,(cmGeneratorExpressionContext *)content,content_00);
      if (context->HadError == true) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,local_b8._M_dataplus._M_p,
                   local_b8._M_dataplus._M_p + local_b8._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00450b92;
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_b8,content);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,
               "Expressions which require the linker language may not be used while evaluating link libraries"
               ,"");
    reportError(context,&local_b8,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    local_98.field_2._M_allocated_capacity = local_b8.field_2._M_allocated_capacity;
    local_98._M_dataplus._M_p = local_b8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) goto LAB_00450b77;
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_98,content);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Expression syntax not recognized.","");
    reportError(context,&local_98,&local_b8);
    local_78.field_2._M_allocated_capacity = local_b8.field_2._M_allocated_capacity;
    _Var7._M_p = local_b8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
LAB_00450b5c:
      operator_delete(_Var7._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
LAB_00450b64:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
LAB_00450b77:
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_00450b92:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string> &parameters,
                       cmGeneratorExpressionContext *context,
                       const GeneratorExpressionContent *content,
                       cmGeneratorExpressionDAGChecker *dagChecker) const
  {
    // Lookup the referenced target.
    std::string name = *parameters.begin();

    if (!cmGeneratorExpression::IsValidTargetName(name))
      {
      ::reportError(context, content->GetOriginalExpression(),
                    "Expression syntax not recognized.");
      return std::string();
      }
    cmTarget* target = context->Makefile->FindTargetToUse(name);
    if(!target)
      {
      ::reportError(context, content->GetOriginalExpression(),
                    "No target \"" + name + "\"");
      return std::string();
      }
    if(target->GetType() >= cmTarget::OBJECT_LIBRARY &&
      target->GetType() != cmTarget::UNKNOWN_LIBRARY)
      {
      ::reportError(context, content->GetOriginalExpression(),
                  "Target \"" + name + "\" is not an executable or library.");
      return std::string();
      }
    if (dagChecker && (dagChecker->EvaluatingLinkLibraries(name.c_str())
        || (dagChecker->EvaluatingSources()
          && name == dagChecker->TopTarget())))
      {
      ::reportError(context, content->GetOriginalExpression(),
                    "Expressions which require the linker language may not "
                    "be used while evaluating link libraries");
      return std::string();
      }
    context->DependTargets.insert(target);
    context->AllTargets.insert(target);

    std::string result =
                TargetFilesystemArtifactResultCreator<ArtifactT>::Create(
                          target,
                          context,
                          content);
    if (context->HadError)
      {
      return std::string();
      }
    return
        TargetFilesystemArtifactResultGetter<ComponentT>::Get(result);
  }